

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLWriter.cxx
# Opt level: O1

void __thiscall cmXMLWriter::Element(cmXMLWriter *this,char *name)

{
  undefined8 in_RAX;
  ostream *poVar1;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  CloseStartElement(this);
  ConditionalLineBreak(this,(bool)(this->IsContent ^ 1));
  uStack_18 = CONCAT17(0x3c,(undefined7)uStack_18);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (this->Output,(char *)((long)&uStack_18 + 7),1);
  if (name == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)poVar1->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,name,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"/>",2);
  return;
}

Assistant:

void cmXMLWriter::Element(const char* name)
{
  this->CloseStartElement();
  this->ConditionalLineBreak(!this->IsContent);
  this->Output << '<' << name << "/>";
}